

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall
despot::util::tinyxml::TiXmlAttribute::Print
          (TiXmlAttribute *this,FILE *cfile,int param_2,TiXmlString *str)

{
  Rep *pRVar1;
  long lVar2;
  char cVar3;
  char *str_00;
  TiXmlString v;
  TiXmlString n;
  TiXmlString local_28;
  TiXmlString local_20;
  
  local_20.rep_ = (Rep *)&TiXmlString::nullrep_;
  local_28.rep_ = (Rep *)&TiXmlString::nullrep_;
  TiXmlBase::EncodeString(&this->name,&local_20);
  TiXmlBase::EncodeString(&this->value,&local_28);
  pRVar1 = (this->value).rep_;
  if ((pRVar1->size != 0) && (cVar3 = pRVar1->str[0], cVar3 != '\0')) {
    lVar2 = 0;
    do {
      if (cVar3 == '\"') {
        if (lVar2 != -1) {
          if (cfile != (FILE *)0x0) {
            fprintf((FILE *)cfile,"%s=\'%s\'",(local_20.rep_)->str,(local_28.rep_)->str);
          }
          if (str == (TiXmlString *)0x0) goto LAB_0016fff2;
          TiXmlString::append(str,(local_20.rep_)->str,(local_20.rep_)->size);
          TiXmlString::append(str,"=\'",2);
          TiXmlString::append(str,(local_28.rep_)->str,(local_28.rep_)->size);
          str_00 = "\'";
          goto LAB_0016ffe5;
        }
        break;
      }
      cVar3 = pRVar1->str[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (cVar3 != '\0');
  }
  if (cfile != (FILE *)0x0) {
    fprintf((FILE *)cfile,"%s=\"%s\"",(local_20.rep_)->str,(local_28.rep_)->str);
  }
  if (str != (TiXmlString *)0x0) {
    TiXmlString::append(str,(local_20.rep_)->str,(local_20.rep_)->size);
    TiXmlString::append(str,"=\"",2);
    TiXmlString::append(str,(local_28.rep_)->str,(local_28.rep_)->size);
    str_00 = "\"";
LAB_0016ffe5:
    TiXmlString::append(str,str_00,1);
  }
LAB_0016fff2:
  if (local_28.rep_ != (Rep *)0x0 && local_28.rep_ != (Rep *)&TiXmlString::nullrep_) {
    operator_delete__(local_28.rep_);
  }
  if (local_20.rep_ != (Rep *)0x0 && local_20.rep_ != (Rep *)&TiXmlString::nullrep_) {
    operator_delete__(local_20.rep_);
  }
  return;
}

Assistant:

void TiXmlAttribute::Print(FILE* cfile, int /*depth*/,
	TIXML_STRING* str) const {
	TIXML_STRING n, v;

	EncodeString(name, &n);
	EncodeString(value, &v);

	if (value.find('\"') == TIXML_STRING::npos) {
		if (cfile) {
			fprintf(cfile, "%s=\"%s\"", n.c_str(), v.c_str());
		}
		if (str) {
			(*str) += n;
			(*str) += "=\"";
			(*str) += v;
			(*str) += "\"";
		}
	} else {
		if (cfile) {
			fprintf(cfile, "%s='%s'", n.c_str(), v.c_str());
		}
		if (str) {
			(*str) += n;
			(*str) += "='";
			(*str) += v;
			(*str) += "'";
		}
	}
}